

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O2

string * __thiscall
choc::text::replace<std::__cxx11::string,char_const(&)[3],char_const(&)[2]>
          (string *__return_storage_ptr__,text *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *textToSearch,
          string_view firstToReplace,string_view firstReplacement,
          char (*otherPairsOfStringsToReplace) [3],char (*otherPairsOfStringsToReplace_1) [2])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *textToSearch_00;
  char *pcVar1;
  string_view firstToReplace_00;
  string_view in_stack_ffffffffffffff88;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,(string *)this);
  replace<std::__cxx11::string>
            ((string *)&stack0xffffffffffffff90,(text *)local_50,textToSearch,firstToReplace,
             in_stack_ffffffffffffff88);
  textToSearch_00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       strlen((char *)firstReplacement._M_len);
  pcVar1 = (char *)strlen(firstReplacement._M_str);
  firstToReplace_00._M_str = pcVar1;
  firstToReplace_00._M_len = firstReplacement._M_len;
  replace<std::__cxx11::string>
            (__return_storage_ptr__,(text *)&stack0xffffffffffffff90,textToSearch_00,
             firstToReplace_00,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string replace (StringType textToSearch, std::string_view firstToReplace, std::string_view firstReplacement,
                     OtherReplacements&&... otherPairsOfStringsToReplace)
{
    static_assert ((sizeof... (otherPairsOfStringsToReplace) & 1u) == 0,
                   "This function expects a list of pairs of strings as its arguments");

    if constexpr (std::is_same<const StringType, const std::string_view>::value || std::is_same<const StringType, const char* const>::value)
    {
        return replace (std::string (textToSearch), firstToReplace, firstReplacement,
                        std::forward<OtherReplacements> (otherPairsOfStringsToReplace)...);
    }
    else if constexpr (sizeof... (otherPairsOfStringsToReplace) == 0)
    {
        size_t pos = 0;

        for (;;)
        {
            pos = textToSearch.find (firstToReplace, pos);

            if (pos == std::string::npos)
                return textToSearch;

            textToSearch.replace (pos, firstToReplace.length(), firstReplacement);
            pos += firstReplacement.length();
        }
    }
    else
    {
        return replace (replace (std::move (textToSearch), firstToReplace, firstReplacement),
                        std::forward<OtherReplacements> (otherPairsOfStringsToReplace)...);
    }
}